

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::VisitPrims
               (Stage *stage,VisitPrimFunction visitor_fun,void *userdata,string *err)

{
  pointer pPVar1;
  long lVar2;
  bool bVar3;
  pointer pTVar4;
  iterator iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long lVar6;
  pointer pTVar7;
  Prim *root;
  pointer root_00;
  ulong uVar8;
  token nameTok;
  Path root_abs_path;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  primNameTable;
  undefined1 local_1a8 [32];
  VisitPrimFunction local_188;
  void *local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  ulong local_158;
  undefined1 local_150 [32];
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0 [2];
  undefined1 local_80 [32];
  _Base_ptr local_60;
  size_t local_58;
  string local_50;
  
  pTVar7 = (stage->stage_metas).primChildren.
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar4 = (stage->stage_metas).primChildren.
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  root_00 = (stage->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (stage->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_188 = visitor_fun;
  local_180 = userdata;
  if ((long)pTVar7 - (long)pTVar4 >> 5 == ((long)pPVar1 - (long)root_00 >> 4) * 0x21cfb2b78c13521d)
  {
    local_80._24_8_ = local_80 + 8;
    local_80._8_4_ = _S_red;
    local_80._16_8_ = (_Link_type)0x0;
    local_58 = 0;
    local_60 = (_Base_ptr)local_80._24_8_;
    if (pPVar1 != root_00) {
      lVar6 = 0;
      uVar8 = 0;
      do {
        local_150._0_8_ = (long)&(root_00->_abs_path)._prim_part._M_dataplus._M_p + lVar6;
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                    *)local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(root_00->_elementPath)._prim_part._M_dataplus._M_p + lVar6),
                   (Prim **)local_150);
        uVar8 = uVar8 + 1;
        root_00 = (stage->_root_nodes).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x350;
      } while (uVar8 < (ulong)(((long)(stage->_root_nodes).
                                      super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)root_00 >>
                               4) * 0x21cfb2b78c13521d));
      pTVar4 = (stage->stage_metas).primChildren.
               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar7 = (stage->stage_metas).primChildren.
               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    if (pTVar7 != pTVar4) {
      lVar6 = 8;
      uVar8 = 0;
      do {
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_1a8 + 0x10);
        lVar2 = *(long *)((long)pTVar4 + lVar6 + -8);
        local_1a8._0_8_ = args;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,lVar2,
                   *(long *)((long)&(pTVar4->str_)._M_dataplus._M_p + lVar6) + lVar2);
        iVar5 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                        *)local_80,(key_type *)local_1a8);
        if (iVar5._M_node == (_Base_ptr)(local_80 + 8)) {
          if (err != (string *)0x0) {
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,
                       "Prim name `{}` in root Layer\'s `primChildren` metadatum not found in Layer root."
                       ,"");
            fmt::format<std::__cxx11::string>
                      ((string *)local_150,(fmt *)&local_178,(string *)local_1a8,args);
            ::std::__cxx11::string::_M_append((char *)err,local_150._0_8_);
            if ((Prim *)local_150._0_8_ != (Prim *)(local_150 + 0x10)) {
              operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
LAB_004c829b:
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
          ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                      *)local_80,(_Link_type)local_80._16_8_);
          return false;
        }
        local_158 = uVar8;
        ::std::operator+(&local_178,"/",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
        Path::Path((Path *)local_150,(string *)&local_178,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        bVar3 = anon_unknown_6::VisitPrimsRec
                          ((Path *)local_150,*(Prim **)(iVar5._M_node + 2),0,local_188,local_180,err
                          );
        uVar8 = local_158;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_p != local_a0) {
          operator_delete(local_b0._M_p,local_a0[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_p != &local_c0) {
          operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_p != &local_e0) {
          operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_p != &local_100) {
          operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_p != &local_120) {
          operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
        }
        if ((Prim *)local_150._0_8_ != (Prim *)(local_150 + 0x10)) {
          operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1a8 + 0x10))
        {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (!bVar3) goto LAB_004c829b;
        uVar8 = uVar8 + 1;
        pTVar4 = (stage->stage_metas).primChildren.
                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x20;
      } while (uVar8 < (ulong)((long)(stage->stage_metas).primChildren.
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4 >> 5)
              );
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                *)local_80,(_Link_type)local_80._16_8_);
  }
  else if (root_00 != pPVar1) {
    do {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                       ,"/",&(root_00->_elementPath)._prim_part);
      local_1a8._0_8_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1a8 + 0x10);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
      Path::Path((Path *)local_150,(string *)local_80,(string *)local_1a8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
        operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
      }
      bVar3 = anon_unknown_6::VisitPrimsRec((Path *)local_150,root_00,0,local_188,local_180,err);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_p != local_a0) {
        operator_delete(local_b0._M_p,local_a0[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_p != &local_c0) {
        operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_p != &local_e0) {
        operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_p != &local_100) {
        operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_p != &local_120) {
        operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
      }
      if ((Prim *)local_150._0_8_ != (Prim *)(local_150 + 0x10)) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      root_00 = root_00 + 1;
    } while (bVar3 && root_00 != pPVar1);
    return bVar3;
  }
  return true;
}

Assistant:

bool VisitPrims(const tinyusdz::Stage &stage, VisitPrimFunction visitor_fun,
                void *userdata, std::string *err) {
  // if `primChildren` is available, use it
  if (stage.metas().primChildren.size() == stage.root_prims().size()) {
    std::map<std::string, const Prim *> primNameTable;
    for (size_t i = 0; i < stage.root_prims().size(); i++) {
      primNameTable.emplace(stage.root_prims()[i].element_name(),
                            &stage.root_prims()[i]);
    }

    for (size_t i = 0; i < stage.metas().primChildren.size(); i++) {
      value::token nameTok = stage.metas().primChildren[i];
      const auto it = primNameTable.find(nameTok.str());
      if (it != primNameTable.end()) {
        const Path root_abs_path("/" + nameTok.str(), "");
        if (!VisitPrimsRec(root_abs_path, *it->second, 0, visitor_fun, userdata,
                           err)) {
          return false;
        }
      } else {
        if (err) {
          (*err) += fmt::format(
              "Prim name `{}` in root Layer's `primChildren` metadatum not "
              "found in Layer root.",
              nameTok.str());
        }
        return false;
      }
    }

  } else {
    for (const auto &root : stage.root_prims()) {
      const Path root_abs_path("/" + root.element_name(), /* prop part */ "");
      if (!VisitPrimsRec(root_abs_path, root, /* root level */ 0, visitor_fun,
                         userdata, err)) {
        return false;
      }
    }
  }

  return true;
}